

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

bool leveldb::GetVarint64(Slice *input,uint64_t *value)

{
  long lVar1;
  char *pcVar2;
  char *limit;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  limit = input->data_ + input->size_;
  pcVar2 = GetVarint64Ptr(input->data_,limit,value);
  if (pcVar2 != (char *)0x0) {
    input->data_ = pcVar2;
    input->size_ = (long)limit - (long)pcVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar2 != (char *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool GetVarint64(Slice* input, uint64_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint64Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}